

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O2

bool vkt::texture::anon_unknown_0::verifyTexCompareResult<tcu::TextureCube>
               (TestContext *testCtx,ConstPixelBufferAccess *result,TextureCube *src,float *texCoord
               ,ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec
               ,PixelFormat *pixelFormat)

{
  int *this;
  TestLog *this_00;
  ConstPixelBufferAccess *pCVar1;
  bool bVar2;
  int iVar3;
  TextureCube *src_00;
  Surface *pSVar4;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int level;
  long lVar5;
  ChannelOrder __fd;
  long lVar6;
  allocator<char> local_33c;
  allocator<char> local_33b;
  allocator<char> local_33a;
  allocator<char> local_339;
  float *local_338;
  ReferenceParams *local_330;
  ConstPixelBufferAccess local_328;
  TexComparePrecision *local_300;
  Vec3 local_2f8;
  Surface reference;
  string local_2c8;
  string local_2a8;
  PixelBufferAccess local_288;
  Surface errorMask;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  ConstPixelBufferAccess *pCStack_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [6];
  TextureCube clampedSource;
  
  this_00 = testCtx->m_log;
  local_338 = texCoord;
  local_330 = sampleParams;
  local_300 = comparePrec;
  tcu::Surface::Surface(&reference,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  tcu::Surface::Surface(&errorMask,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  local_328.m_format.order = pixelFormat->redBits;
  local_328.m_format.type = pixelFormat->greenBits;
  local_328.m_size.m_data[0] = pixelFormat->blueBits;
  local_328.m_size.m_data[1] = pixelFormat->alphaBits;
  tcu::operator-((tcu *)local_248,(Vector<int,_4> *)&local_328,1);
  tcu::computeFixedPointThreshold((tcu *)&clampedSource,(IVec4 *)local_248);
  local_2f8.m_data[2] = (float)clampedSource._12_4_;
  bVar2 = isFloatingPointDepthFormat(&src->m_format);
  if (bVar2) {
    tcu::TextureCube::TextureCube(&clampedSource,src);
    for (lVar5 = 0;
        lVar5 < (int)(((long)clampedSource.m_access[0].
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)clampedSource.m_access[0].
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28); lVar5 = lVar5 + 1) {
      for (lVar6 = 0; lVar6 != 0x90; lVar6 = lVar6 + 0x18) {
        clampFloatingPointTexture
                  ((PixelBufferAccess *)
                   (*(long *)((long)&clampedSource.m_access[0].
                                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar6) +
                   lVar5 * 0x28));
      }
    }
    tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)&local_328,&reference,pixelFormat);
    local_218[0]._M_allocated_capacity = clampedSource.m_view.m_levels[5];
    local_228._M_p = (pointer)clampedSource.m_view.m_levels[3];
    pCStack_220 = clampedSource.m_view.m_levels[4];
    local_238._M_allocated_capacity = (size_type)clampedSource.m_view.m_levels[1];
    local_238._8_8_ = clampedSource.m_view.m_levels[2];
    local_248._0_8_ = clampedSource.m_view._0_8_;
    local_248._8_8_ = clampedSource.m_view.m_levels[0];
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)&local_328,(TextureCubeView *)local_248,local_338,local_330);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_328,&reference);
    tcu::Surface::getAccess(&local_288,&errorMask);
    src_00 = (TextureCube *)local_248;
    local_218[0]._M_allocated_capacity = clampedSource.m_view.m_levels[5];
    local_228._M_p = (pointer)clampedSource.m_view.m_levels[3];
    pCStack_220 = clampedSource.m_view.m_levels[4];
    local_238._M_allocated_capacity = (size_type)clampedSource.m_view.m_levels[1];
    local_238._8_8_ = clampedSource.m_view.m_levels[2];
    local_248._0_8_ = clampedSource.m_view._0_8_;
    local_248._8_8_ = clampedSource.m_view.m_levels[0];
    iVar3 = glu::TextureTestUtil::computeTextureCompareDiff
                      (result,&local_328,&local_288,(TextureCubeView *)src_00,local_338,local_330,
                       local_300,lodPrec,&local_2f8);
    tcu::TextureCube::~TextureCube(&clampedSource);
  }
  else {
    tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)local_248,&reference,pixelFormat);
    clampedSource.m_data[1].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(src->m_view).m_levels[5];
    pCVar1 = (src->m_view).m_levels[0];
    clampedSource.m_data[0].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(src->m_view).m_levels[1];
    clampedSource.m_data[0].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(src->m_view).m_levels[2];
    clampedSource.m_data[0].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(src->m_view).m_levels[3];
    clampedSource.m_data[1].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(src->m_view).m_levels[4];
    clampedSource.m_format.order = (ChannelOrder)*(undefined8 *)&src->m_view;
    clampedSource.m_format.type = (ChannelType)((ulong)*(undefined8 *)&src->m_view >> 0x20);
    clampedSource.m_size = (int)pCVar1;
    clampedSource._12_4_ = SUB84((ulong)pCVar1 >> 0x20,0);
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)local_248,(TextureCubeView *)&clampedSource,local_338,local_330);
    tcu::Surface::getAccess((PixelBufferAccess *)local_248,&reference);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_328,&errorMask);
    clampedSource.m_data[1].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(src->m_view).m_levels[5];
    src_00 = &clampedSource;
    pCVar1 = (src->m_view).m_levels[0];
    clampedSource.m_data[0].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(src->m_view).m_levels[1];
    clampedSource.m_data[0].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(src->m_view).m_levels[2];
    clampedSource.m_data[0].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(src->m_view).m_levels[3];
    clampedSource.m_data[1].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(src->m_view).m_levels[4];
    clampedSource.m_format.order = (ChannelOrder)*(undefined8 *)&src->m_view;
    clampedSource.m_format.type = (ChannelType)((ulong)*(undefined8 *)&src->m_view >> 0x20);
    clampedSource.m_size = (int)pCVar1;
    clampedSource._12_4_ = SUB84((ulong)pCVar1 >> 0x20,0);
    iVar3 = glu::TextureTestUtil::computeTextureCompareDiff
                      (result,(ConstPixelBufferAccess *)local_248,(PixelBufferAccess *)&local_328,
                       (TextureCubeView *)src_00,local_338,local_330,local_300,lodPrec,&local_2f8);
  }
  __fd = (ChannelOrder)this_00;
  if (0 < iVar3) {
    this = &clampedSource.m_size;
    clampedSource.m_format.type = (ChannelType)((ulong)this_00 >> 0x20);
    clampedSource.m_format.order = __fd;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,"ERROR: Result verification failed, got ");
    std::ostream::operator<<(this,iVar3);
    std::operator<<((ostream *)this," invalid pixels!");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&clampedSource,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"VerifyResult",&local_339)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"Verification result",&local_33a);
  tcu::LogImageSet::LogImageSet((LogImageSet *)local_248,(string *)&local_328,(string *)&local_288);
  tcu::LogImageSet::write((LogImageSet *)local_248,__fd,__buf,(size_t)src_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Rendered",&local_33b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"Rendered image",&local_33c);
  tcu::LogImage::LogImage
            ((LogImage *)&clampedSource,&local_2a8,&local_2c8,result,QP_IMAGE_COMPRESSION_MODE_BEST)
  ;
  tcu::LogImage::write((LogImage *)&clampedSource,__fd,__buf_00,(size_t)result);
  tcu::LogImage::~LogImage((LogImage *)&clampedSource);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)local_248);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_328);
  if (0 < iVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"Reference",&local_339);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"Ideal reference image",&local_33a);
    pSVar4 = &reference;
    tcu::LogImage::LogImage
              ((LogImage *)&clampedSource,(string *)&local_328,(string *)&local_288,pSVar4,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&clampedSource,__fd,__buf_01,(size_t)pSVar4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"ErrorMask",&local_33b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"Error mask",&local_33c)
    ;
    pSVar4 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)local_248,&local_2a8,&local_2c8,pSVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_248,__fd,__buf_02,(size_t)pSVar4);
    tcu::LogImage::~LogImage((LogImage *)local_248);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2a8);
    tcu::LogImage::~LogImage((LogImage *)&clampedSource);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_328);
  }
  tcu::TestLog::endImageSet(this_00);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&reference);
  return iVar3 == 0;
}

Assistant:

bool verifyTexCompareResult (tcu::TestContext&						testCtx,
							 const tcu::ConstPixelBufferAccess&		result,
							 const TextureType&						src,
							 const float*							texCoord,
							 const ReferenceParams&					sampleParams,
							 const tcu::TexComparePrecision&		comparePrec,
							 const tcu::LodPrecision&				lodPrec,
							 const tcu::PixelFormat&				pixelFormat)
{
	tcu::TestLog&	log					= testCtx.getLog();
	tcu::Surface	reference			(result.getWidth(), result.getHeight());
	tcu::Surface	errorMask			(result.getWidth(), result.getHeight());
	const tcu::Vec3	nonShadowThreshold	= tcu::computeFixedPointThreshold(getBitsVec(pixelFormat)-1).swizzle(1,2,3);
	int				numFailedPixels;

	// sampleTexture() expects source image to be the same state as it would be in a GL implementation, that is
	// the floating point depth values should be in [0, 1] range as data is clamped during texture upload. Since
	// we don't have a separate "uploading" phase and just reuse the buffer we used for GL-upload, do the clamping
	// here if necessary.

	if (isFloatingPointDepthFormat(src.getFormat()))
	{
		TextureType clampedSource(src);

		clampFloatingPointTexture(clampedSource);

		// sample clamped values

		sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), clampedSource, texCoord, sampleParams);
		numFailedPixels = computeTextureCompareDiff(result, reference.getAccess(), errorMask.getAccess(), clampedSource, texCoord, sampleParams, comparePrec, lodPrec, nonShadowThreshold);
	}
	else
	{
		// sample raw values (they are guaranteed to be in [0, 1] range as the format cannot represent any other values)

		sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), src, texCoord, sampleParams);
		numFailedPixels = computeTextureCompareDiff(result, reference.getAccess(), errorMask.getAccess(), src, texCoord, sampleParams, comparePrec, lodPrec, nonShadowThreshold);
	}

	if (numFailedPixels > 0)
		log << TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

	log << TestLog::ImageSet("VerifyResult", "Verification result")
		<< TestLog::Image("Rendered", "Rendered image", result);

	if (numFailedPixels > 0)
	{
		log << TestLog::Image("Reference", "Ideal reference image", reference)
			<< TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << TestLog::EndImageSet;

	return numFailedPixels == 0;
}